

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall Descriptor_GetNode_sh_wsh_Test::TestBody(Descriptor_GetNode_sh_wsh_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *rhs;
  char *in_R9;
  AssertHelper local_1558;
  Message local_1550;
  DescriptorScriptReference local_1548 [848];
  Script local_11f8;
  string local_11c0 [32];
  undefined1 local_11a0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1170;
  Message local_1168;
  DescriptorScriptReference local_1160 [855];
  bool local_e09;
  undefined1 local_e08 [8];
  AssertionResult gtest_ar__1;
  Message local_df0;
  Script local_de8;
  string local_db0 [32];
  undefined1 local_d90 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_d60;
  Message local_d58;
  bool local_d49;
  undefined1 local_d48 [8];
  AssertionResult gtest_ar_;
  Message local_d30;
  string local_d28 [32];
  undefined1 local_d08 [8];
  AssertionResult gtest_ar;
  Message local_cf0;
  vector local_ce8 [848];
  AssertHelper local_998;
  Message local_990;
  DescriptorNode local_988 [360];
  AssertHelper local_820;
  Message local_818 [2];
  string local_808 [360];
  DescriptorNode local_6a0 [8];
  DescriptorNode node;
  DescriptorScriptReference local_538 [8];
  DescriptorScriptReference script_ref;
  undefined1 local_1e8 [8];
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  string local_30 [8];
  string descriptor;
  Descriptor_GetNode_sh_wsh_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
             &local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)local_1e8);
  cfd::core::DescriptorScriptReference::DescriptorScriptReference(local_538);
  cfd::core::DescriptorNode::DescriptorNode(local_6a0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse(local_808,(vector *)local_30);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)local_808);
      cfd::core::Descriptor::~Descriptor((Descriptor *)local_808);
    }
  }
  else {
    testing::Message::Message(local_818);
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x35c,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_820,local_818);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    testing::Message::~Message(local_818);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetNode();
      cfd::core::DescriptorNode::operator=(local_6a0,local_988);
      cfd::core::DescriptorNode::~DescriptorNode(local_988);
    }
  }
  else {
    testing::Message::Message(&local_990);
    testing::internal::AssertHelper::AssertHelper
              (&local_998,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x35d,
               "Expected: node = desc.GetNode() doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=(&local_998,&local_990);
    testing::internal::AssertHelper::~AssertHelper(&local_998);
    testing::Message::~Message(&local_990);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference(local_ce8);
      cfd::core::DescriptorScriptReference::operator=
                (local_538,(DescriptorScriptReference *)local_ce8);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)local_ce8);
    }
  }
  else {
    testing::Message::Message(&local_cf0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x35e,
               "Expected: script_ref = desc.GetReference() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_cf0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_cf0);
  }
  cfd::core::DescriptorNode::ToString_abi_cxx11_(SUB81(local_d28,0));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d08,"node.ToString(false).c_str()","descriptor.c_str()",pcVar3,rhs);
  std::__cxx11::string::~string(local_d28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d08);
  if (!bVar1) {
    testing::Message::Message(&local_d30);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x35f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d08);
  bVar2 = cfd::core::DescriptorScriptReference::HasRedeemScript();
  local_d49 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d48,&local_d49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d48);
  if (!bVar1) {
    testing::Message::Message(&local_d58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_d48,
               (AssertionResult *)"script_ref.HasRedeemScript()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x360,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d60,&local_d58);
    testing::internal::AssertHelper::~AssertHelper(&local_d60);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d48);
  cfd::core::DescriptorScriptReference::GetRedeemScript();
  cfd::core::Script::ToString_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d90,"script_ref.GetRedeemScript().ToString().c_str()",
             "\"0 fc5acc302aab97f821f9a61e1cc572e7968a603551e95d4ba12b51df6581482f\"",pcVar3,
             "0 fc5acc302aab97f821f9a61e1cc572e7968a603551e95d4ba12b51df6581482f");
  std::__cxx11::string::~string(local_db0);
  cfd::core::Script::~Script(&local_de8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d90);
  if (!bVar1) {
    testing::Message::Message(&local_df0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x362,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_df0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_df0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d90);
  cfd::core::DescriptorScriptReference::GetChild();
  bVar2 = cfd::core::DescriptorScriptReference::HasRedeemScript();
  local_e09 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e08,&local_e09,(type *)0x0);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference(local_1160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e08);
  if (!bVar1) {
    testing::Message::Message(&local_1168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_e08,
               (AssertionResult *)"script_ref.GetChild().HasRedeemScript()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x363,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1170,&local_1168);
    testing::internal::AssertHelper::~AssertHelper(&local_1170);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e08);
  cfd::core::DescriptorScriptReference::GetChild();
  cfd::core::DescriptorScriptReference::GetRedeemScript();
  cfd::core::Script::ToString_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_11a0,"script_ref.GetChild().GetRedeemScript().ToString().c_str()",
             "\"OP_DUP OP_HASH160 c42e7ef92fdb603af844d064faad95db9bcdfd3d OP_EQUALVERIFY OP_CHECKSIG\""
             ,pcVar3,
             "OP_DUP OP_HASH160 c42e7ef92fdb603af844d064faad95db9bcdfd3d OP_EQUALVERIFY OP_CHECKSIG"
            );
  std::__cxx11::string::~string(local_11c0);
  cfd::core::Script::~Script(&local_11f8);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference(local_1548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a0);
  if (!bVar1) {
    testing::Message::Message(&local_1550);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_11a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x365,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1558,&local_1550);
    testing::internal::AssertHelper::~AssertHelper(&local_1558);
    testing::Message::~Message(&local_1550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a0);
  cfd::core::DescriptorNode::~DescriptorNode(local_6a0);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference(local_538);
  cfd::core::Script::~Script((Script *)local_1e8);
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, GetNode_sh_wsh) {
  std::string descriptor = "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))";
  Descriptor desc;
  Script locking_script;
  DescriptorScriptReference script_ref;
  DescriptorNode node;

  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(node = desc.GetNode());
  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_STREQ(node.ToString(false).c_str(), descriptor.c_str());
  EXPECT_TRUE(script_ref.HasRedeemScript());
  EXPECT_STREQ(script_ref.GetRedeemScript().ToString().c_str(),
      "0 fc5acc302aab97f821f9a61e1cc572e7968a603551e95d4ba12b51df6581482f");
  EXPECT_TRUE(script_ref.GetChild().HasRedeemScript());
  EXPECT_STREQ(script_ref.GetChild().GetRedeemScript().ToString().c_str(),
      "OP_DUP OP_HASH160 c42e7ef92fdb603af844d064faad95db9bcdfd3d OP_EQUALVERIFY OP_CHECKSIG");
}